

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O2

bool qt_u_strToCase(QString *str,QString *out,char *localeID,Ptr_u_strToCase caseFunc)

{
  int iVar1;
  int32_t iVar2;
  QChar *pQVar3;
  char16_t *pcVar4;
  bool bVar5;
  undefined1 *size;
  long in_FS_OFFSET;
  UErrorCode status;
  UErrorCode local_4c;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)(str->d).size;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)&local_48,(long)((iVar1 >> 2) + iVar1),Uninitialized);
  local_4c = U_ZERO_ERROR;
  pQVar3 = QString::data((QString *)&local_48);
  pcVar4 = (str->d).ptr;
  if (pcVar4 == (UChar_conflict *)0x0) {
    pcVar4 = L"";
  }
  iVar2 = (*caseFunc)(&pQVar3->ucs,(int32_t)local_48.size,pcVar4,(int32_t)(str->d).size,localeID,
                      &local_4c);
  if (local_4c < U_ILLEGAL_ARGUMENT_ERROR || local_4c == U_BUFFER_OVERFLOW_ERROR) {
    size = (undefined1 *)(long)iVar2;
    if ((long)size < local_48.size) {
      QString::resize((QString *)&local_48,(qsizetype)size);
    }
    else if ((ulong)local_48.size < size) {
      QString::resize((QString *)&local_48,(qsizetype)size);
      local_4c = U_ZERO_ERROR;
      pQVar3 = QString::data((QString *)&local_48);
      pcVar4 = (str->d).ptr;
      if (pcVar4 == (UChar_conflict *)0x0) {
        pcVar4 = L"";
      }
      iVar2 = (*caseFunc)(&pQVar3->ucs,(int32_t)local_48.size,pcVar4,(int32_t)(str->d).size,localeID
                          ,&local_4c);
      if ((U_ZERO_ERROR < local_4c) || ((undefined1 *)local_48.size != (undefined1 *)(long)iVar2))
      goto LAB_003a6263;
    }
    QString::operator=(out,(QString *)&local_48);
    bVar5 = true;
  }
  else {
LAB_003a6263:
    bVar5 = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_u_strToCase(const QString &str, QString *out, const char *localeID, Ptr_u_strToCase caseFunc)
{
    Q_ASSERT(out);

    int32_t size = str.size();
    size += size >> 2; // add 25% for possible expansions
    QString result(size, Qt::Uninitialized);

    UErrorCode status = U_ZERO_ERROR;

    size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

    if (U_FAILURE(status) && status != U_BUFFER_OVERFLOW_ERROR)
        return false;

    if (size < result.size()) {
        result.resize(size);
    } else if (size > result.size()) {
        // the resulting string is larger than our source string
        result.resize(size);

        status = U_ZERO_ERROR;
        size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

        if (U_FAILURE(status))
            return false;

        // if the sizes don't match now, we give up.
        if (size != result.size())
            return false;
    }

    *out = result;
    return true;
}